

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICache.cxx
# Opt level: O2

Value * cmFileAPICacheDump(Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  _Head_base<0UL,_cmState_*,_false> this;
  pointer pbVar1;
  bool bVar2;
  CacheEntryType type;
  Value *pVVar3;
  string *value;
  cmValue cVar4;
  Value *this_00;
  pointer value_00;
  allocator<char> local_169;
  String *local_168;
  Value *local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  Value local_118;
  Value local_f0;
  Value local_c8;
  Value local_a0;
  String local_78;
  Value local_58;
  
  this._M_head_impl =
       (fileAPI->CMakeInstance->State)._M_t.
       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
       super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_160 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_a0,arrayValue);
  cmState::GetCacheEntryKeys_abi_cxx11_(&names,this._M_head_impl);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  while (local_168 = names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    Json::Value::Value(&local_118,objectValue);
    Json::Value::Value(&local_c8,local_168);
    pVVar3 = Json::Value::operator[](&local_118,"name");
    Json::Value::operator=(pVVar3,&local_c8);
    Json::Value::~Value(&local_c8);
    type = cmState::GetCacheEntryType(this._M_head_impl,local_168);
    value = cmState::CacheEntryTypeToString_abi_cxx11_(type);
    Json::Value::Value(&local_c8,value);
    pVVar3 = Json::Value::operator[](&local_118,"type");
    Json::Value::operator=(pVVar3,&local_c8);
    Json::Value::~Value(&local_c8);
    cmState::GetSafeCacheEntryValue((string *)&local_58,this._M_head_impl,local_168);
    Json::Value::Value(&local_c8,(String *)&local_58);
    pVVar3 = Json::Value::operator[](&local_118,"value");
    Json::Value::operator=(pVVar3,&local_c8);
    Json::Value::~Value(&local_c8);
    std::__cxx11::string::~string((string *)&local_58);
    Json::Value::Value(&local_f0,arrayValue);
    cmState::GetCacheEntryPropertyList(&props,this._M_head_impl,local_168);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               props.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pbVar1 = props.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (value_00 = props.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; value_00 != pbVar1;
        value_00 = value_00 + 1) {
      Json::Value::Value(&local_58,objectValue);
      Json::Value::Value(&local_c8,value_00);
      pVVar3 = Json::Value::operator[](&local_58,"name");
      Json::Value::operator=(pVVar3,&local_c8);
      Json::Value::~Value(&local_c8);
      cVar4 = cmState::GetCacheEntryProperty(this._M_head_impl,local_168,value_00);
      if (cVar4.Value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_169);
      }
      else {
        std::__cxx11::string::string((string *)&local_78,(string *)cVar4.Value);
      }
      Json::Value::Value(&local_c8,&local_78);
      pVVar3 = Json::Value::operator[](&local_58,"value");
      Json::Value::operator=(pVVar3,&local_c8);
      Json::Value::~Value(&local_c8);
      std::__cxx11::string::~string((string *)&local_78);
      Json::Value::append(&local_f0,&local_58);
      Json::Value::~Value(&local_58);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&props);
    bVar2 = Json::Value::empty(&local_f0);
    if (!bVar2) {
      pVVar3 = Json::Value::operator[](&local_118,"properties");
      Json::Value::operator=(pVVar3,&local_f0);
    }
    Json::Value::~Value(&local_f0);
    Json::Value::append(&local_a0,&local_118);
    Json::Value::~Value(&local_118);
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_168 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&names);
  pVVar3 = local_160;
  this_00 = Json::Value::operator[](local_160,"entries");
  Json::Value::operator=(this_00,&local_a0);
  Json::Value::~Value(&local_a0);
  return pVVar3;
}

Assistant:

Cache::Cache(cmFileAPI& fileAPI, unsigned long version)
  : FileAPI(fileAPI)
  , Version(version)
  , State(this->FileAPI.GetCMakeInstance()->GetState())
{
  static_cast<void>(this->Version);
}